

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
          (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *this)

{
  AnyNumber<Kernel::MonomFactor> *pAVar1;
  ulong uVar2;
  
  pAVar1 = this->_stack;
  if (pAVar1 != (AnyNumber<Kernel::MonomFactor> *)0x0) {
    uVar2 = this->_capacity << 5;
    if (uVar2 == 0) {
      *(undefined8 *)
       &(pAVar1->
        super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        )._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *(undefined8 *)
       &(pAVar1->
        super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        )._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *(undefined8 *)
       &(pAVar1->
        super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        )._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(pAVar1,0x10);
      return;
    }
    *(undefined8 *)
     &(pAVar1->
      super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      )._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
         = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }